

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int64_t iVar3;
  real *prVar4;
  runtime_error *this_00;
  long in_RDX;
  DenseMatrix *in_RDI;
  int64_t j;
  real d;
  int64_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  real in_stack_ffffffffffffffbc;
  long local_28;
  real local_1c;
  
  if (in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x59,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((in_RDI->super_Matrix).m_ <= in_RDX) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x5a,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  iVar3 = Vector::size((Vector *)0x1700f1);
  if (iVar3 != (in_RDI->super_Matrix).n_) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x5b,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  local_1c = 0.0;
  for (local_28 = 0; local_28 < (in_RDI->super_Matrix).n_; local_28 = local_28 + 1) {
    prVar4 = at(in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                (int64_t)in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffffbc = *prVar4;
    prVar4 = Vector::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)*prVar4),ZEXT416((uint)in_stack_ffffffffffffffbc),
                             ZEXT416((uint)local_1c));
    local_1c = auVar1._0_4_;
  }
  uVar2 = std::isnan((double)(ulong)(uint)local_1c);
  if ((uVar2 & 1) == 0) {
    return local_1c;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Encountered NaN.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw std::runtime_error("Encountered NaN.");
  }
  return d;
}